

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

int PAL_sprintf(char *buffer,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  LONG Length;
  char *format_local;
  char *buffer_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38._4_4_ = 0x30;
  local_38._0_4_ = 0x10;
  ap[0].reg_save_area._4_4_ = PAL__vsnprintf(buffer,0x7fffffff,format,(__va_list_tag *)local_38);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return ap[0].reg_save_area._4_4_;
}

Assistant:

__attribute__((no_instrument_function))
int
__cdecl
PAL_sprintf(
          char *buffer,
          const char *format,
          ...)
{
    LONG Length;
    va_list ap;

    PERF_ENTRY(sprintf);
    ENTRY("PAL_sprintf (buffer=%p, format=%p (%s))\n", buffer, format, format);

    va_start(ap, format);
    Length = PAL__vsnprintf(buffer, 0x7fffffff, format, ap);
    va_end(ap);

    LOGEXIT("PAL_sprintf returns int %d\n", Length);
    PERF_EXIT(sprintf);
    return Length;
}